

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportTextTest.cpp
# Opt level: O0

void __thiscall GtestReportTextTest::GtestReportTextTest(GtestReportTextTest *this)

{
  shared_ptr<oout::SuccessResult> local_1d8;
  shared_ptr<oout::SuccessResult> local_1c8;
  shared_ptr<oout::SuccessResult> local_1b8;
  shared_ptr<oout::SuccessResult> local_1a8;
  shared_ptr<oout::TestResult> local_198;
  unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> local_188;
  shared_ptr<oout::ContainTest> local_180;
  shared_ptr<oout::SuccessResult> local_170;
  shared_ptr<oout::SuccessResult> local_160;
  undefined1 local_150 [24];
  shared_ptr<oout::SuccessResult> local_138;
  shared_ptr<oout::SuccessResult> local_128;
  undefined1 local_118 [24];
  shared_ptr<oout::FailureResult> local_100;
  shared_ptr<oout::FailureResult> local_f0;
  shared_ptr<oout::NamedResult> local_e0;
  undefined1 local_d0 [24];
  shared_ptr<oout::SuccessResult> local_b8;
  shared_ptr<oout::SuccessResult> local_a8;
  shared_ptr<oout::NamedResult> local_98;
  undefined1 local_88 [40];
  shared_ptr<oout::FailureResult> local_60;
  shared_ptr<oout::FailureResult> local_50;
  shared_ptr<oout::NamedResult> local_40;
  undefined1 local_30 [24];
  unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> local_18;
  GtestReportTextTest *local_10;
  GtestReportTextTest *this_local;
  
  local_10 = this;
  oout::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__GtestReportTextTest_00324c10;
  std::make_shared<oout::FailureResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::FailureResult>>(&local_50);
  std::make_shared<oout::NamedResult,char_const(&)[9],std::shared_ptr<oout::TestResult>>
            ((char (*) [9])&local_40,(shared_ptr<oout::TestResult> *)0x2c5c07);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)local_30);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[22]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_30 + 8),(char (*) [22])local_30);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_a8);
  std::make_shared<oout::NamedResult,char_const(&)[8],std::shared_ptr<oout::TestResult>>
            ((char (*) [8])&local_98,(shared_ptr<oout::TestResult> *)0x2c5c1d);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)local_88);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[21]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_88 + 8),(char (*) [21])local_88);
  std::make_shared<oout::FailureResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::FailureResult>>(&local_f0);
  std::make_shared<oout::NamedResult,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            ((char (*) [10])&local_e0,(shared_ptr<oout::TestResult> *)0x2c5c32);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)local_d0);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[23]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_d0 + 8),(char (*) [23])local_d0);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_128);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::TestResult>>
            ((shared_ptr<oout::TestResult> *)local_118);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[21]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_118 + 8),(char (*) [21])local_118);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_160);
  std::make_unique<oout::GtestReportText,std::shared_ptr<oout::TestResult>>
            ((shared_ptr<oout::TestResult> *)local_150);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[25]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             (local_150 + 8),(char (*) [25])local_150);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_1a8);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_1c8);
  std::
  make_unique<oout::SuiteResult,std::shared_ptr<oout::TestResult>,std::shared_ptr<oout::TestResult>>
            (&local_198,(shared_ptr<oout::TestResult> *)&local_1a8);
  std::
  make_unique<oout::NamedResult,char_const(&)[6],std::unique_ptr<oout::SuiteResult,std::default_delete<oout::SuiteResult>>>
            ((char (*) [6])
             &local_198.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)0x2c5c83);
  std::
  make_unique<oout::GtestReportText,std::unique_ptr<oout::NamedResult,std::default_delete<oout::NamedResult>>>
            ((unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> *)&local_188);
  std::
  make_shared<oout::ContainTest,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[31]>
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_180,(char (*) [31])&local_188);
  std::
  make_unique<oout::NamedTest,char_const(&)[20],std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>>
            ((char (*) [20])&local_18,(shared_ptr<oout::ContainTest> *)"GtestReportTextTest",
             (shared_ptr<oout::ContainTest> *)(local_30 + 8),
             (shared_ptr<oout::ContainTest> *)(local_88 + 8),
             (shared_ptr<oout::ContainTest> *)(local_d0 + 8),
             (shared_ptr<oout::ContainTest> *)(local_118 + 8),
             (shared_ptr<oout::ContainTest> *)(local_150 + 8));
  std::unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>>::
  unique_ptr<oout::NamedTest,std::default_delete<oout::NamedTest>,void>
            ((unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>> *)&this->tests,
             &local_18);
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr(&local_18);
  std::shared_ptr<oout::ContainTest>::~shared_ptr(&local_180);
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            (&local_188);
  std::unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_>::~unique_ptr
            ((unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> *)
             &local_198.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_198);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_1c8);
  std::shared_ptr<oout::SuccessResult>::~shared_ptr(&local_1d8);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_1a8);
  std::shared_ptr<oout::SuccessResult>::~shared_ptr(&local_1b8);
  std::shared_ptr<oout::ContainTest>::~shared_ptr((shared_ptr<oout::ContainTest> *)(local_150 + 8));
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_150);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_160);
  std::shared_ptr<oout::SuccessResult>::~shared_ptr(&local_170);
  std::shared_ptr<oout::ContainTest>::~shared_ptr((shared_ptr<oout::ContainTest> *)(local_118 + 8));
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_118);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_128);
  std::shared_ptr<oout::SuccessResult>::~shared_ptr(&local_138);
  std::shared_ptr<oout::ContainTest>::~shared_ptr((shared_ptr<oout::ContainTest> *)(local_d0 + 8));
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_d0);
  std::shared_ptr<oout::NamedResult>::~shared_ptr(&local_e0);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_f0);
  std::shared_ptr<oout::FailureResult>::~shared_ptr(&local_100);
  std::shared_ptr<oout::ContainTest>::~shared_ptr((shared_ptr<oout::ContainTest> *)(local_88 + 8));
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_88);
  std::shared_ptr<oout::NamedResult>::~shared_ptr(&local_98);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_a8);
  std::shared_ptr<oout::SuccessResult>::~shared_ptr(&local_b8);
  std::shared_ptr<oout::ContainTest>::~shared_ptr((shared_ptr<oout::ContainTest> *)(local_30 + 8));
  std::unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_>::~unique_ptr
            ((unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             local_30);
  std::shared_ptr<oout::NamedResult>::~shared_ptr(&local_40);
  std::shared_ptr<oout::TestResult>::~shared_ptr((shared_ptr<oout::TestResult> *)&local_50);
  std::shared_ptr<oout::FailureResult>::~shared_ptr(&local_60);
  return;
}

Assistant:

GtestReportTextTest::GtestReportTextTest()
: tests(
	make_unique<NamedTest>(
		"GtestReportTextTest",
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"run test",
					make_shared<TestResult>(make_shared<FailureResult>())
				)
			),
			"[ RUN      ] run test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"ok test",
					make_shared<TestResult>(make_shared<SuccessResult>())
				)
			),
			"[       OK ] ok test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"fail test",
					make_shared<TestResult>(make_shared<FailureResult>())
				)
			),
			"[  FAILED  ] fail test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<TestResult>(make_shared<SuccessResult>())
			),
			"[==========] Running"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<TestResult>(make_shared<SuccessResult>())
			),
			"[==========] 1 tests ran"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_unique<NamedResult>(
					"SUITE",
					make_unique<SuiteResult>(
						make_shared<TestResult>(
							make_shared<SuccessResult>()
						),
						make_shared<TestResult>(
							make_shared<SuccessResult>()
						)
					)
				)
			),
			"[----------] 2 test from SUITE"
		)
	)
)
{
}